

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void ImGui::RenderArrow(ImDrawList *draw_list,ImVec2 pos,ImU32 col,ImGuiDir dir,float scale)

{
  ImVec2 *p3;
  int in_EDX;
  long in_RDI;
  ImVec2 this;
  ImVec2 p1;
  ImVec2 p2;
  float in_XMM1_Da;
  ImVec2 c;
  ImVec2 b;
  ImVec2 a;
  ImVec2 center;
  float r;
  float h;
  ImVec2 *lhs;
  char *in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffffa0;
  ImU32 IVar1;
  ImVec2 *in_stack_ffffffffffffffa8;
  ImDrawList *in_stack_ffffffffffffffb0;
  ImVec2 local_48;
  ImVec2 local_40;
  ImVec2 local_38;
  ImVec2 local_30;
  float local_24;
  float local_20;
  int local_18;
  undefined8 local_10;
  
  IVar1 = (ImU32)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
  local_20 = *(float *)(*(long *)(in_RDI + 0x38) + 0x10);
  local_24 = local_20 * 0.4 * in_XMM1_Da;
  local_18 = in_EDX;
  local_10 = in_RDI;
  ImVec2::ImVec2(&local_38);
  ImVec2::ImVec2(&local_40);
  ImVec2::ImVec2(&local_48);
  p3 = (ImVec2 *)(ulong)(local_18 + 1);
  switch(p3) {
  case (ImVec2 *)0x0:
  case (ImVec2 *)0x5:
  default:
    lhs = &local_30;
    IVar1 = local_10._4_4_;
    this = operator+(lhs,(ImVec2 *)0x188b22);
    p1 = operator+(lhs,(ImVec2 *)0x188b36);
    p2 = operator+(lhs,(ImVec2 *)0x188b4a);
    ImDrawList::AddTriangleFilled((ImDrawList *)this,(ImVec2 *)p1,(ImVec2 *)p2,p3,IVar1);
    break;
  case (ImVec2 *)0x1:
    ImDrawList::AddText(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,IVar1,(char *)p3,
                        in_stack_ffffffffffffff90);
    break;
  case (ImVec2 *)0x2:
    ImDrawList::AddText(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,IVar1,(char *)p3,
                        in_stack_ffffffffffffff90);
    break;
  case (ImVec2 *)0x3:
    ImDrawList::AddText(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,IVar1,(char *)p3,
                        in_stack_ffffffffffffff90);
    break;
  case (ImVec2 *)0x4:
    ImDrawList::AddText(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,IVar1,(char *)p3,
                        in_stack_ffffffffffffff90);
  }
  return;
}

Assistant:

void ImGui::RenderArrow(ImDrawList* draw_list, ImVec2 pos, ImU32 col, ImGuiDir dir, float scale)
{
    const float h = draw_list->_Data->FontSize * 1.00f;
    float r = h * 0.40f * scale;
    ImVec2 center = pos;

    ImVec2 a, b, c;
    switch (dir)
    {
    //case ImGuiDir_Up:
    //case ImGuiDir_Down:
    //    if (dir == ImGuiDir_Up) r = -r;
    //    a = ImVec2(+0.000f,+0.750f) * r;
    //    b = ImVec2(-0.866f,-0.750f) * r;
    //    c = ImVec2(+0.866f,-0.750f) * r;
    //    break;
    //case ImGuiDir_Left:
    //case ImGuiDir_Right:
    //    if (dir == ImGuiDir_Left) r = -r;
    //    a = ImVec2(+0.750f,+0.000f) * r;
    //    b = ImVec2(-0.750f,+0.866f) * r;
    //    c = ImVec2(-0.750f,-0.866f) * r;
    //    break;
    case ImGuiDir_Left:  draw_list->AddText(center, col, "<"); return;
    case ImGuiDir_Right: draw_list->AddText(center, col, ">"); return;
    case ImGuiDir_Up:    draw_list->AddText(center, col, "^"); return;
    case ImGuiDir_Down:  draw_list->AddText(center, col, "v"); return;
    case ImGuiDir_None:
    case ImGuiDir_COUNT:
        IM_ASSERT(0);
        break;
    }
    draw_list->AddTriangleFilled(center + a, center + b, center + c, col);
}